

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

LClosure * luaF_newLclosure(lua_State *L,int nupvals)

{
  LClosure *pLVar1;
  LClosure *c;
  GCObject *o;
  int nupvals_local;
  lua_State *L_local;
  
  pLVar1 = (LClosure *)luaC_newobj(L,'\x06',(ulong)(uint)nupvals * 8 + 0x20);
  pLVar1->p = (Proto *)0x0;
  pLVar1->nupvalues = (lu_byte)nupvals;
  o._4_4_ = nupvals;
  while (o._4_4_ != 0) {
    pLVar1->upvals[o._4_4_ + -1] = (UpVal *)0x0;
    o._4_4_ = o._4_4_ + -1;
  }
  return pLVar1;
}

Assistant:

LClosure *luaF_newLclosure (lua_State *L, int nupvals) {
  GCObject *o = luaC_newobj(L, LUA_VLCL, sizeLclosure(nupvals));
  LClosure *c = gco2lcl(o);
  c->p = NULL;
  c->nupvalues = cast_byte(nupvals);
  while (nupvals--) c->upvals[nupvals] = NULL;
  return c;
}